

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O0

cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
* __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
::operator++(cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
             *this)

{
  bool bVar1;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  *p_Var2;
  __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
  *__rhs;
  reference pvVar3;
  reference pvVar4;
  size_type local_18;
  ssize_t i;
  cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>_>
  *this_local;
  
  bVar1 = at_end(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!at_end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/iterator.hh"
                  ,0x29a,
                  "tchecker::cartesian_iterator_t<R> &tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>>::operator++() [R = tchecker::range_t<tchecker::system::edges_collection_const_iterator_t>]"
                 );
  }
  local_18 = this->_nranges;
  while( true ) {
    local_18 = local_18 - 1;
    if ((long)local_18 < 0) {
      return this;
    }
    p_Var2 = &std::
              vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
              ::operator[](&this->_its,local_18)->super_const_iterator;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(p_Var2);
    p_Var2 = &std::
              vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
              ::operator[](&this->_its,local_18)->super_const_iterator;
    __rhs = &std::
             vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
             ::operator[](&this->_ends,local_18)->super_const_iterator;
    bVar1 = __gnu_cxx::operator!=(p_Var2,__rhs);
    if (bVar1) break;
    if (0 < (long)local_18) {
      pvVar3 = std::
               vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ::operator[](&this->_begins,local_18);
      pvVar4 = std::
               vector<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
               ::operator[](&this->_its,local_18);
      (pvVar4->super_const_iterator)._M_current = (pvVar3->super_const_iterator)._M_current;
    }
  }
  return this;
}

Assistant:

tchecker::cartesian_iterator_t<R> & operator++()
  {
    assert(!at_end());

    ssize_t i = _nranges - 1;
    while (i >= 0) {
      ++_its[i];
      if (_its[i] != _ends[i]) // range i not at end
        break;
      if (i > 0) // set range i to beginning if not done
        _its[i] = _begins[i];
      --i;
    }
    return *this;
  }